

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O1

XMLFilePos __thiscall xercesc_4_0::XMLReader::getSrcOffset(XMLReader *this)

{
  XMLFilePos XVar1;
  RuntimeException *this_00;
  ulong uVar2;
  
  if ((this->fSrcOfsSupported == true) && (this->fCalculateSrcOfs != false)) {
    uVar2 = this->fCharIndex;
    if (uVar2 == 0) {
      XVar1 = this->fSrcOfsBase;
    }
    else {
      XVar1 = this->fSrcOfsBase;
      if (uVar2 < this->fCharsAvail) {
        uVar2 = (ulong)this->fCharOfsBuf[uVar2];
      }
      else {
        XVar1 = XVar1 + this->fCharOfsBuf[uVar2 - 1];
        uVar2 = (ulong)this->fCharSizeBuf[uVar2 - 1];
      }
      XVar1 = XVar1 + uVar2;
    }
    return XVar1;
  }
  this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
  RuntimeException::RuntimeException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
             ,0x1fc,Reader_SrcOfsNotSupported,this->fMemoryManager);
  __cxa_throw(this_00,&RuntimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

XMLFilePos XMLReader::getSrcOffset() const
{
    if (!fSrcOfsSupported || !fCalculateSrcOfs)
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Reader_SrcOfsNotSupported, fMemoryManager);

    //
    //  Take the current source offset and add in the sizes that we've
    //  eaten from the source so far.
    //
    if( fCharIndex == 0 ) {
        return fSrcOfsBase;
    }

    if( fCharIndex < fCharsAvail ) {

        return (fSrcOfsBase + fCharOfsBuf[fCharIndex]);
    }

    return (fSrcOfsBase + fCharOfsBuf[fCharIndex-1] + fCharSizeBuf[fCharIndex-1]);
}